

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_hamt_map.cpp
# Opt level: O0

void __thiscall
DefaultIndexFixture_InsertHeap_Test::~DefaultIndexFixture_InsertHeap_Test
          (DefaultIndexFixture_InsertHeap_Test *this)

{
  DefaultIndexFixture_InsertHeap_Test *this_local;
  
  ~DefaultIndexFixture_InsertHeap_Test(this);
  operator_delete(this,0x160);
  return;
}

Assistant:

TEST_F (DefaultIndexFixture, InsertHeap) {
    transaction_type t1 = begin (db_, lock_guard{mutex_});
    auto const first = std::make_pair ("a"s, "b"s);
    auto const second = std::make_pair ("c"s, "d"s);
    index_->insert_or_assign (t1, first);
    index_->insert_or_assign (t1, second);

    default_index::iterator begin = index_->begin (db_);
    default_index::iterator end = index_->end (db_);
    EXPECT_NE (begin, end);
    ++begin;
    EXPECT_NE (begin, end);
    ++begin;
    EXPECT_EQ (begin, end);
}